

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O1

void __thiscall anurbs::RTree<3L>::add(RTree<3L> *this,Vector *box_a,Vector *box_b)

{
  pointer pMVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  pointer plVar5;
  pointer pMVar6;
  Index i_1;
  long lVar7;
  Index i;
  long lVar8;
  double dVar9;
  Vector box_max;
  Vector box_min;
  
  lVar7 = this->m_position;
  plVar5 = (this->m_indices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
           super__Vector_impl_data._M_start;
  this->m_position = lVar7 + 1;
  plVar5[lVar7] = lVar7;
  lVar8 = 0;
  do {
    dVar3 = (box_a->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
            array[lVar8];
    dVar4 = (box_b->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
            array[lVar8];
    dVar9 = dVar4;
    if (dVar4 <= dVar3) {
      dVar9 = dVar3;
      dVar3 = dVar4;
    }
    box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
    [lVar8] = dVar3;
    box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
    [lVar8] = dVar9;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  pMVar6 = (this->m_boxes_min).
           super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = pMVar6 + lVar7;
  (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[0] =
       box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [0];
  *(double *)
   ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data +
   8) = box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [1];
  *(double *)
   ((long)&pMVar6[lVar7].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) =
       box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  pMVar6 = (this->m_boxes_max).
           super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar1 = pMVar6 + lVar7;
  (pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.array[0] =
       box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [0];
  *(double *)
   ((long)&(pMVar1->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data +
   8) = box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
        [1];
  *(double *)
   ((long)&pMVar6[lVar7].super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
           m_data + 0x10) =
       box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.array
       [2];
  lVar7 = 0;
  do {
    dVar3 = box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[lVar7];
    if (dVar3 < (this->m_min).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
                .m_data.array[lVar7]) {
      (this->m_min).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
      array[lVar7] = dVar3;
    }
    dVar3 = box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[lVar7];
    pdVar2 = (this->m_max).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
             m_data.array + lVar7;
    if (*pdVar2 <= dVar3 && dVar3 != *pdVar2) {
      (this->m_max).super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
      array[lVar7] = dVar3;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  return;
}

Assistant:

void add(const Vector box_a, const Vector box_b)
    {
        // FIXME: check m_position

        Index index = m_position++;

        m_indices[index] = index;

        Vector box_min;
        Vector box_max;

        for (Index i = 0; i < dimension(); i++) {
            if (box_a[i] < box_b[i]) {
                box_min[i] = box_a[i];
                box_max[i] = box_b[i];
            } else {
                box_min[i] = box_b[i];
                box_max[i] = box_a[i];
            }
        }

        m_boxes_min[index] = box_min;
        m_boxes_max[index] = box_max;

        for (Index i = 0; i < dimension(); i++) {
            if (box_min[i] < m_min[i]) {
                m_min[i] = box_min[i];
            }
            if (box_max[i] > m_max[i]) {
                m_max[i] = box_max[i];
            }
        }
    }